

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::TableStruct
     ::InitDefaultsImpl(void)

{
  internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
            );
  internal::InitProtobufDefaults();
  protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  _Version_default_instance_ = &PTR__Version_0041fdf0;
  _DAT_00428be8 = 0;
  uRam0000000000428bf0 = 0;
  _DAT_00428bf8 = &internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_00428c00 = 0;
  _DAT_00428c08 = 0;
  DAT_00428c10 = 1;
  _CodeGeneratorRequest_default_instance_ = &PTR__CodeGeneratorRequest_0041fec0;
  _DAT_00428c20 = 0;
  uRam0000000000428c28 = 0;
  _DAT_00428c30 = 0;
  uRam0000000000428c38 = 0;
  _DAT_00428c40 = 0;
  uRam0000000000428c48 = 0;
  _DAT_00428c50 = 0;
  uRam0000000000428c58 = 0;
  _DAT_00428c60 = &internal::fixed_address_empty_string_abi_cxx11_;
  DAT_00428c70 = 1;
  _CodeGeneratorResponse_File_default_instance_ = &PTR__CodeGeneratorResponse_File_0041ff90;
  _DAT_00428c80 = 0;
  uRam0000000000428c88 = 0;
  _DAT_00428c90 = &internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_00428c98 = &internal::fixed_address_empty_string_abi_cxx11_;
  _DAT_00428ca0 = &internal::fixed_address_empty_string_abi_cxx11_;
  DAT_00428ca8 = 1;
  _CodeGeneratorResponse_default_instance_ = &PTR__CodeGeneratorResponse_00420060;
  _DAT_00428cd8 = 0;
  _DAT_00428cc8 = 0;
  uRam0000000000428cd0 = 0;
  _DAT_00428cb8 = 0;
  uRam0000000000428cc0 = 0;
  _DAT_00428ce0 = &internal::fixed_address_empty_string_abi_cxx11_;
  DAT_00428ce8 = 1;
  _DAT_00428c68 = &_Version_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  _Version_default_instance_.DefaultConstruct();
  _CodeGeneratorRequest_default_instance_.DefaultConstruct();
  _CodeGeneratorResponse_File_default_instance_.DefaultConstruct();
  _CodeGeneratorResponse_default_instance_.DefaultConstruct();
  _CodeGeneratorRequest_default_instance_.get_mutable()->compiler_version_ = const_cast< ::google::protobuf::compiler::Version*>(
      ::google::protobuf::compiler::Version::internal_default_instance());
}